

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
S2RegionTermIndexer::GetIndexTerms_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,S2RegionTermIndexer *this,S2Region *region,string_view prefix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Options *pOVar4;
  undefined1 local_50 [8];
  S2CellUnion covering;
  S2Region *region_local;
  S2RegionTermIndexer *this_local;
  string_view prefix_local;
  
  covering.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)region;
  pOVar4 = S2RegionCoverer::mutable_options(&this->coverer_);
  iVar1 = (this->options_).super_Options.min_level_;
  iVar2 = (this->options_).super_Options.max_level_;
  iVar3 = (this->options_).super_Options.level_mod_;
  pOVar4->max_cells_ = (this->options_).super_Options.max_cells_;
  pOVar4->min_level_ = iVar1;
  pOVar4->max_level_ = iVar2;
  pOVar4->level_mod_ = iVar3;
  S2RegionCoverer::GetCovering
            ((S2CellUnion *)local_50,&this->coverer_,
             (S2Region *)
             covering.cell_ids_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  GetIndexTermsForCanonicalCovering_abi_cxx11_
            (__return_storage_ptr__,this,(S2CellUnion *)local_50,prefix);
  S2CellUnion::~S2CellUnion((S2CellUnion *)local_50);
  return __return_storage_ptr__;
}

Assistant:

vector<string> S2RegionTermIndexer::GetIndexTerms(const S2Region& region,
                                                  string_view prefix) {
  // Note that options may have changed since the last call.
  *coverer_.mutable_options() = options_;
  S2CellUnion covering = coverer_.GetCovering(region);
  return GetIndexTermsForCanonicalCovering(covering, prefix);
}